

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::decodeArray
          (SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t param_2,
          uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  pointer puVar2;
  ulong *puVar3;
  uint uVar4;
  NotEnoughStorage *this_00;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  uint bit;
  pointer local_60;
  uint *local_58;
  uint32_t *local_50;
  ulong *local_48;
  SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *local_40;
  ulong local_38;
  
  uVar1 = *in;
  if (*nvalue < (ulong)(uVar1 << 7)) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,(ulong)*in);
    __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar6 = in + 1;
  local_50 = out;
  local_48 = nvalue;
  if (uVar1 != 0) {
    uVar5 = 0;
    local_40 = this;
    do {
      uVar4 = *puVar6;
      uVar7 = uVar4 >> 0x10 & 0x3ff;
      puVar6 = puVar6 + 1;
      local_38 = uVar5;
      if (((uVar4 & 0xffff) != 0) &&
         (local_60 = (this->exceptions).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start, this = local_40, local_58 = puVar6,
         uVar7 != 0)) {
        puVar2 = local_60 + (ulong)uVar7 * 2;
        do {
          (**(code **)(Simple16<false>::unpackarray + (ulong)(*local_58 >> 0x1c) * 8))
                    (&local_60,&local_58);
          this = local_40;
        } while (local_60 < puVar2);
      }
      bit = uVar4 >> 0x1a;
      usimdunpack((__m128i *)(puVar6 + ((ulong)uVar4 & 0xffff)),out,bit);
      if (uVar7 != 0) {
        puVar2 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = 0xffffffff;
        uVar8 = 0;
        do {
          uVar5 = (ulong)(uint)((int)uVar5 + 1 + *(int *)((long)puVar2 + uVar8));
          out[uVar5] = out[uVar5] |
                       *(int *)((long)puVar2 + uVar8 + (uVar7 << 2)) + 1 << (bit & 0x1f);
          uVar8 = uVar8 + 4;
        } while (uVar7 << 2 != uVar8);
      }
      puVar6 = (uint *)((long)*(__m128i *)(puVar6 + ((ulong)uVar4 & 0xffff)) + (ulong)(bit << 4));
      out = out + 0x80;
      uVar4 = (int)local_38 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != uVar1);
  }
  puVar3 = local_48;
  uVar5 = (long)out - (long)local_50 >> 2;
  if (*local_48 < uVar5) {
    SIMDNewPFor<4u,FastPForLib::Simple16<false>>::decodeArray();
  }
  *puVar3 = uVar5;
  return puVar6;
}

Assistant:

const uint32_t *
SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeArray(
#ifndef NDEBUG
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
#else
    const uint32_t *in, const size_t, uint32_t *out, size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);

  if (BlockSize * (*in) > nvalue)
    throw NotEnoughStorage(*in);
  const uint32_t numBlocks = *in++;

  for (uint32_t i = 0; i < numBlocks; i++) {

    const uint32_t b = *in >> (32 - PFORDELTA_B);

    const size_t nExceptions =
        (*in >> (32 - (PFORDELTA_B + PFORDELTA_NEXCEPT))) &
        ((1 << PFORDELTA_NEXCEPT) - 1);

    const uint32_t encodedExceptionsSize =
        *in & ((1 << PFORDELTA_EXCEPTSZ) - 1);

    size_t twonexceptions = 2 * nExceptions;
    ++in;
    if (encodedExceptionsSize > 0)
      ecoder.decodeArray(in, encodedExceptionsSize, &exceptions[0],
                         twonexceptions);
    assert(twonexceptions >= 2 * nExceptions);
    in += encodedExceptionsSize;

    uint32_t *beginout(out); // we use this later
    usimdunpack(reinterpret_cast<const __m128i *>(in), out, b);
    in += 4 * b;
    out += 128;

    for (uint32_t e = 0, lpos = 0u-1; e < nExceptions; e++) {
      lpos += exceptions[e] + 1;
      beginout[lpos] |= (exceptions[e + nExceptions] + 1) << b;
    }
  }
  if (static_cast<size_t>(out - initout) > nvalue) {
    fprintf(stderr, "possible buffer overrun\n");
  }
  ASSERT(in <= len + initin,
      std::to_string(in - initin) + " " + std::to_string(len));

  nvalue = out - initout;
  assert(nvalue == numBlocks * BlockSize);
  return in;
}